

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.c
# Opt level: O0

void AbsPathNormalize(tchar_t *Abs)

{
  tchar_t *ptVar1;
  char *local_18;
  tchar_t *i;
  tchar_t *Abs_local;
  
  ptVar1 = GetProtocol(Abs,(tchar_t *)0x0,0,(bool_t *)0x0);
  local_18 = Abs;
  if (ptVar1 != Abs) {
    for (; *local_18 != '\0'; local_18 = local_18 + 1) {
      if (*local_18 == '\\') {
        *local_18 = '/';
      }
    }
  }
  return;
}

Assistant:

void AbsPathNormalize(tchar_t* Abs)
{
    if (GetProtocol(Abs,NULL,0,NULL)!=Abs)
    {
        tchar_t *i;
        for (i=Abs;*i;++i)
            if (*i == '\\')
                *i = '/';
    }
    else
    {
#if defined(TARGET_WIN)
        tchar_t *i;
        for (i=Abs;*i;++i)
            if (*i == '/')
                *i = '\\';
#endif
    }
}